

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_multimap_pair_Test::TestBody(Btree_multimap_pair_Test *this)

{
  _Base_ptr this_00;
  Generator<std::pair<int,_int>_> *this_01;
  undefined1 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  void *__s;
  pair<int,_int> pVar5;
  pair<int,_int> pVar6;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *extraout_RDX;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *extraout_RDX_00;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *values;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *values_00;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *values_01;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *values_02;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  n;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_05;
  size_type n_00;
  int i;
  int iVar7;
  long lVar8;
  int in_R8D;
  char *pcVar9;
  AssertionResult AVar10;
  int64_t original_bytes1_2;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  random_values;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  duplicate_values;
  multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  container;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  sorted_values;
  int64_t bytes2;
  PropagatingCountingAlloc<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  allocator1;
  AssertHelper local_140;
  pair<int,_int> local_138;
  AssertHelper local_130;
  undefined1 local_128 [8];
  pair<int,_int> local_120;
  pointer ppStack_118;
  AssertHelperData *local_110;
  undefined1 local_108 [8];
  pair<int,_int> local_100;
  _Base_ptr local_f8;
  _Rb_tree_node_base local_f0;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  local_d0;
  undefined1 local_a0 [24];
  undefined1 local_88 [32];
  undefined1 local_68 [8];
  Generator<std::pair<int,_int>_> GStack_60;
  pair<int,_int> local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  local_40;
  CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  local_38;
  
  (anonymous_namespace)::
  ConstTest<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
            ();
  GenerateValuesWithSeed<std::pair<std::pair<int,int>,std::pair<int,int>>>
            ((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              *)local_128,(priv *)0x2710,40000,testing::FLAGS_gtest_random_seed,in_R8D);
  local_f0._M_right = (_Base_ptr)(local_108 + 0x18);
  local_f0._0_8_ =
       &btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
        ::EmptyNode()::empty_node;
  local_f0._M_parent =
       (_Base_ptr)
       &btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
        ::EmptyNode()::empty_node;
  local_f0._M_left = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            *)local_88,
           (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            *)local_128);
  uVar3 = local_88._8_8_;
  uVar2 = local_88._0_8_;
  values = extraout_RDX;
  if (local_88._0_8_ != local_88._8_8_) {
    uVar4 = (long)(local_88._8_8_ - local_88._0_8_) >> 4;
    lVar8 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_88._0_8_,local_88._8_8_,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar2,uVar3);
    values = extraout_RDX_00;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            (local_108 + 0x18,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)local_88,values);
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>>
            (local_88._0_8_,local_88._8_8_);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            (local_108 + 0x18,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)local_88,values_00);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            (local_108 + 0x18,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)local_128,values_01);
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            *)local_108,
           (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            *)local_128);
  std::
  vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>const*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>>
            ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              *)local_108,local_100,local_128,local_120);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            (local_108 + 0x18,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)local_108,values_02);
  __s = operator_new(0x640);
  local_a0._0_8_ = __s;
  local_a0._16_8_ = (_Base_ptr)((long)__s + 0x640);
  memset(__s,0,0x640);
  this_00 = (_Base_ptr)(local_88 + 0x20);
  local_68 = (undefined1  [8])0x200000002;
  GStack_60.tgen.maxval = 2;
  GStack_60.ugen.maxval = 2;
  local_a0._8_8_ = (_Base_ptr)((long)__s + 0x640);
  pVar5 = Generator<std::pair<int,_int>_>::operator()((Generator<std::pair<int,_int>_> *)this_00,2);
  pVar6 = Generator<std::pair<int,_int>_>::operator()(&GStack_60,2);
  lVar8 = 0xc;
  do {
    *(int *)((long)__s + lVar8 + -0xc) = pVar5.first;
    *(int *)((long)__s + lVar8 + -8) = pVar5.second;
    *(int *)((long)__s + lVar8 + -4) = pVar6.first;
    *(int *)((long)__s + lVar8) = pVar6.second;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x64c);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            (local_108 + 0x18,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)local_a0,
             (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              *)((ulong)pVar6 >> 0x20));
  operator_delete(__s,0x640);
  if ((pair<int,_int>)local_108 != (pair<int,_int>)0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  if ((Generator<std::pair<int,_int>_>)local_88._0_8_ != (Generator<std::pair<int,_int>_>)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree(&local_d0);
  btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  ::~btree((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
            *)(local_108 + 0x18));
  if ((pair<int,_int>)local_128 != (pair<int,_int>)0x0) {
    operator_delete((void *)local_128,(long)ppStack_118 - (long)local_128);
  }
  local_f0._0_8_ = (_Base_ptr)0x0;
  Generator<std::pair<int,_int>_>::operator()
            ((Generator<std::pair<int,_int>_> *)(local_108 + 0x18),0);
  local_68 = (undefined1  [8])0x0;
  local_88._0_4_ = 1000;
  local_88._4_4_ = 1000;
  local_88._8_8_ = (pointer)0x3e8000003e8;
  local_a0._0_4_ = 0x20;
  local_a0._4_4_ = 0;
  local_40.bytes_used_ = (int64_t *)this_00;
  local_38.bytes_used_ = (int64_t *)local_a0;
  local_48 = (_Base_ptr)operator_new(0x20);
  local_68 = (undefined1  [8])((long)local_68 + 0x20);
  local_50 = (_Base_ptr)operator_new(0x20);
  local_f0._0_8_ =
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_right = (_Base_ptr)0x0;
  local_108 = (undefined1  [8])local_a0._0_8_;
  local_f0._M_parent = (_Base_ptr)local_a0;
  pVar5 = Generator<std::pair<int,_int>_>::operator()((Generator<std::pair<int,_int>_> *)local_88,0)
  ;
  this_01 = (Generator<std::pair<int,_int>_> *)(local_88 + 8);
  local_120 = Generator<std::pair<int,_int>_>::operator()(this_01,0);
  local_128 = (undefined1  [8])pVar5;
  btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
            *)(local_108 + 0x18),(value_type *)local_128);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_128,"bytes1","original_bytes1",(long *)local_a0,(long *)local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_120;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar9);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_120 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  }
  if (local_f0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                      *)(local_108 + 0x18),(node_type *)local_f0._0_8_);
  }
  local_f0._0_8_ =
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_right = (_Base_ptr)0x0;
  local_138.first = 0;
  local_138.second = 0;
  local_140.data_ = (AssertHelperData *)((ulong)local_140.data_._4_4_ << 0x20);
  local_f0._M_parent = this_00;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_128,"b1.size()","0",(unsigned_long *)&local_138,(int *)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_120;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar9);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_120 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  }
  local_138.first = 0;
  local_138.second = 0;
  local_140.data_ = local_140.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_128,"b2.size()","0",(unsigned_long *)&local_138,(int *)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_120;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar9);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_120 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_128,"bytes1","original_bytes1",(long *)local_a0,(long *)local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_120;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar9);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_120 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  }
  iVar7 = 1;
  do {
    pVar5 = Generator<std::pair<int,_int>_>::operator()
                      ((Generator<std::pair<int,_int>_> *)local_88,iVar7);
    local_120 = Generator<std::pair<int,_int>_>::operator()(this_01,iVar7);
    local_128 = (undefined1  [8])pVar5;
    btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
              *)(local_108 + 0x18),(value_type *)local_128);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_128,"bytes2","bytes1",(long *)(local_88 + 0x20),(long *)local_a0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_120;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar9);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_120 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  }
  if (local_f0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                      *)(local_108 + 0x18),(node_type *)local_f0._0_8_);
  }
  local_f0._0_8_ =
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_right = (_Base_ptr)0x0;
  local_108 = (undefined1  [8])local_a0._0_8_;
  local_f0._M_parent = (_Base_ptr)local_a0;
  pVar5 = Generator<std::pair<int,_int>_>::operator()((Generator<std::pair<int,_int>_> *)local_88,0)
  ;
  local_120 = Generator<std::pair<int,_int>_>::operator()(this_01,0);
  local_128 = (undefined1  [8])pVar5;
  btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
            *)(local_108 + 0x18),(value_type *)local_128);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_128,"bytes1","original_bytes1",(long *)local_a0,(long *)local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_120;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar9);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_120 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  }
  if (local_f0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                      *)(local_108 + 0x18),(node_type *)local_f0._0_8_);
  }
  local_f0._0_8_ =
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_right = (_Base_ptr)0x0;
  local_138.first = 0;
  local_138.second = 0;
  local_140.data_ = local_140.data_ & 0xffffffff00000000;
  local_f0._M_parent = (_Base_ptr)(local_88 + 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_128,"b1.size()","0",(unsigned_long *)&local_138,(int *)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_120;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar9);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_120 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_128,"bytes1","original_bytes1",(long *)local_a0,(long *)local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_120;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar9);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_120 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  }
  iVar7 = 1;
  do {
    pVar5 = Generator<std::pair<int,_int>_>::operator()
                      ((Generator<std::pair<int,_int>_> *)local_88,iVar7);
    local_120 = Generator<std::pair<int,_int>_>::operator()(this_01,iVar7);
    local_128 = (undefined1  [8])pVar5;
    btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
              *)(local_108 + 0x18),(value_type *)local_128);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_128,"bytes2","bytes1",(long *)(local_88 + 0x20),(long *)local_a0);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_120 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_120;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar9);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_120 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  }
  if (local_f0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                      *)(local_108 + 0x18),(node_type *)local_f0._0_8_);
  }
  local_f0._0_8_ =
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_right = (_Base_ptr)0x0;
  local_138.first = local_a0._0_4_;
  local_138.second = local_a0._4_4_;
  local_f0._M_parent = (_Base_ptr)local_a0;
  pVar5 = Generator<std::pair<int,_int>_>::operator()((Generator<std::pair<int,_int>_> *)local_88,0)
  ;
  local_100 = Generator<std::pair<int,_int>_>::operator()(this_01,0);
  local_108 = (undefined1  [8])pVar5;
  btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
            *)(local_108 + 0x18),(value_type *)local_108);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_108,"bytes1","original_bytes1",(long *)local_a0,(long *)&local_138);
  if (local_108[0] ==
      (vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
       )0x0) {
    testing::Message::Message((Message *)&local_140);
    if (local_100 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar9);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_140.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_140.data_ + 8))();
    }
  }
  if (local_100 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  local_88._24_8_ = local_f0._M_right;
  local_128 = (undefined1  [8])local_f0._0_8_;
  local_120 = (pair<int,_int>)local_f0._M_parent;
  ppStack_118 = (pointer)local_f0._M_left;
  local_f0._0_8_ =
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  puVar1 = (undefined1 *)local_f0._0_8_;
  local_f0._M_color = local_128._0_4_;
  local_f0._4_4_ = local_128._4_4_;
  local_58.first = local_f0._M_color;
  local_58.second = local_f0._4_4_;
  local_f0._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  local_f0._M_right = (_Base_ptr)0x0;
  local_110 = (AssertHelperData *)local_88._24_8_;
  local_140.data_ = (AssertHelperData *)0x0;
  local_130.data_._0_4_ = 0;
  local_f0._0_8_ = puVar1;
  local_f0._M_parent = (_Base_ptr)(local_88 + 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"b1.size()","0",(unsigned_long *)&local_140,(int *)&local_130);
  if (local_108[0] ==
      (vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
       )0x0) {
    testing::Message::Message((Message *)&local_140);
    if (local_100 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar9);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_140.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_140.data_ + 8))();
    }
  }
  if (local_100 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  local_140.data_ = (AssertHelperData *)local_88._24_8_;
  local_130.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"b2.size()","1",(unsigned_long *)&local_140,(int *)&local_130);
  if (local_108[0] ==
      (vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
       )0x0) {
    testing::Message::Message((Message *)&local_140);
    if (local_100 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar9);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_140.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_140.data_ + 8))();
    }
  }
  if (local_100 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_108,"bytes1","original_bytes1",(long *)local_a0,(long *)&local_138);
  if (local_108[0] ==
      (vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
       )0x0) {
    testing::Message::Message((Message *)&local_140);
    if (local_100 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar9);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_140.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_140.data_ + 8))();
    }
  }
  if (local_100 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  iVar7 = 1;
  do {
    pVar5 = Generator<std::pair<int,_int>_>::operator()
                      ((Generator<std::pair<int,_int>_> *)local_88,iVar7);
    local_100 = Generator<std::pair<int,_int>_>::operator()(this_01,iVar7);
    local_108 = (undefined1  [8])pVar5;
    btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
              *)(local_108 + 0x18),(value_type *)local_108);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 1000);
  AVar10 = testing::internal::CmpHelperGT<long,long>
                     ((internal *)local_108,"bytes2","bytes1",(long *)(local_88 + 0x20),
                      (long *)local_a0);
  n._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar10.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_108[0] ==
      (vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
       )0x0) {
    testing::Message::Message((Message *)&local_140);
    if (local_100 == (pair<int,_int>)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_100;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar9);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    n = extraout_RDX_01.
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
    if (local_140.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_140.data_ + 8))();
      n._M_head_impl = extraout_RDX_02;
    }
  }
  if (local_100 != (pair<int,_int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    n._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_03.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if ((AssertHelperData *)local_88._24_8_ != (AssertHelperData *)0x0) {
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                      *)local_128,(node_type *)local_58);
    n._M_head_impl = extraout_RDX_04;
  }
  if (local_f0._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                      *)(local_108 + 0x18),(node_type *)local_f0._0_8_);
    n._M_head_impl = extraout_RDX_05._M_head_impl;
  }
  CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  ::deallocate(&local_38,(pointer)local_48,(size_type)n._M_head_impl);
  CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  ::deallocate(&local_40,(pointer)local_50,n_00);
  return;
}

Assistant:

void BtreeMultiTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        multi_checker<T, C> container;

        // Test keys in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test keys in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test keys in random order.
        DoTest("random:    ", &container, random_values);

        // Test keys in random order w/ duplicates.
        std::vector<V> duplicate_values(random_values);
        duplicate_values.insert(duplicate_values.end(), random_values.begin(),
                                random_values.end());
        DoTest("duplicates:", &container, duplicate_values);

        // Test all identical keys.
        std::vector<V> identical_values(100);
        std::fill(identical_values.begin(), identical_values.end(),
                  Generator<V>(2)(2));
        DoTest("identical: ", &container, identical_values);
    }